

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O0

void __thiscall
CStringKMerFactory128::create_kmers_direction
          (CStringKMerFactory128 *this,
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          *mers,char *s)

{
  long in_RDX;
  int64_t *in_RSI;
  bool *in_RDI;
  __uint128_t *unaff_retaddr;
  uchar in_stack_0000000f;
  KMerFactory128 *in_stack_00000010;
  uint64_t p;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  *this_00;
  bool *fkmer;
  
  in_RDI[0x18] = false;
  in_RDI[0x19] = false;
  in_RDI[0x1a] = false;
  in_RDI[0x1b] = false;
  in_RDI[0x1c] = false;
  in_RDI[0x1d] = false;
  in_RDI[0x1e] = false;
  in_RDI[0x1f] = false;
  in_RDI[0x10] = false;
  in_RDI[0x11] = false;
  in_RDI[0x12] = false;
  in_RDI[0x13] = false;
  in_RDI[0x14] = false;
  in_RDI[0x15] = false;
  in_RDI[0x16] = false;
  in_RDI[0x17] = false;
  in_RDI[0x28] = false;
  in_RDI[0x29] = false;
  in_RDI[0x2a] = false;
  in_RDI[0x2b] = false;
  in_RDI[0x2c] = false;
  in_RDI[0x2d] = false;
  in_RDI[0x2e] = false;
  in_RDI[0x2f] = false;
  in_RDI[0x20] = false;
  in_RDI[0x21] = false;
  in_RDI[0x22] = false;
  in_RDI[0x23] = false;
  in_RDI[0x24] = false;
  in_RDI[0x25] = false;
  in_RDI[0x26] = false;
  in_RDI[0x27] = false;
  in_RDI[8] = false;
  in_RDI[9] = false;
  in_RDI[10] = false;
  in_RDI[0xb] = false;
  in_RDI[0xc] = false;
  in_RDI[0xd] = false;
  in_RDI[0xe] = false;
  in_RDI[0xf] = false;
  this_00 = (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
             *)0x0;
  fkmer = in_RDI;
  while (*(char *)((long)&(this_00->
                          super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + in_RDX) != '\0') {
    KMerFactory128::fillKBuf
              (in_stack_00000010,in_stack_0000000f,unaff_retaddr,(__uint128_t *)fkmer,in_RSI);
    this_00 = (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
               *)((long)&(this_00->
                         super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    if ((long)(ulong)*in_RDI <= *(long *)(in_RDI + 8)) {
      if (*(ulong *)(in_RDI + 0x28) < *(ulong *)(in_RDI + 0x18) ||
          *(ulong *)(in_RDI + 0x28) - *(ulong *)(in_RDI + 0x18) <
          (ulong)(*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x10))) {
        in_stack_ffffffffffffffde = 1;
        std::
        vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>::
        emplace_back<unsigned__int128&,bool>
                  (this_00,(unsigned___int128 *)
                           CONCAT17(in_stack_ffffffffffffffdf,CONCAT16(1,in_stack_ffffffffffffffd8))
                   ,in_RDI);
      }
      else {
        in_stack_ffffffffffffffdf = 0;
        std::
        vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>::
        emplace_back<unsigned__int128&,bool>
                  (this_00,(unsigned___int128 *)
                           (ulong)CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),
                   in_RDI);
      }
    }
  }
  return;
}

Assistant:

const void create_kmers_direction(std::vector<std::pair<__uint128_t,bool>> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer,false);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer,true);
                }
            }
        }
    }